

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

char * __thiscall
CVmObjByteArray::cast_to_string(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *new_str)

{
  vm_obj_id_t obj;
  char *pcVar1;
  vm_val_t *in_RDX;
  CVmByteArraySource src;
  vm_val_t *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffa4;
  vm_obj_id_t in_stack_ffffffffffffffac;
  CVmByteArraySource *in_stack_ffffffffffffffb0;
  
  CVmByteArraySource::CVmByteArraySource(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  obj = CVmObjString::create_latin1(in_stack_ffffffffffffffa4,(CVmDataSource *)in_RDX);
  vm_val_t::set_obj(in_RDX,obj);
  pcVar1 = vm_val_t::get_as_string(in_stack_ffffffffffffff88);
  CVmByteArraySource::~CVmByteArraySource((CVmByteArraySource *)0x31983b);
  return pcVar1;
}

Assistant:

const char *CVmObjByteArray::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *new_str) const
{
    /* set up a source stream to read from the byte array into the string */
    CVmByteArraySource src(vmg_ self);

    /* create the string */
    new_str->set_obj(CVmObjString::create_latin1(vmg_ FALSE, &src));

    /* return the new string's byte buffer */
    return new_str->get_as_string(vmg0_);
}